

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_util.H
# Opt level: O0

DeviceVector<amrex::BCRec> *
amrex::convertToDeviceVector<amrex::BCRec>(Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *v)

{
  Long LVar1;
  BCRec *__dest;
  BCRec *__src;
  DeviceVector<amrex::BCRec> *in_RDI;
  int ncomp;
  DeviceVector<amrex::BCRec> *v_d;
  DeviceVector<amrex::BCRec> *this;
  
  this = in_RDI;
  LVar1 = Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::size
                    ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x53f54c);
  PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::PODVector(this,(size_type)in_RDI);
  __dest = PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data(this);
  __src = std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
                    ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x53f57d);
  memcpy(__dest,__src,(long)(int)LVar1 * 0x18);
  return in_RDI;
}

Assistant:

Gpu::DeviceVector<T>
    convertToDeviceVector ( Vector<T> v)
    {
        int ncomp = v.size();
        Gpu::DeviceVector<T> v_d(ncomp);
#ifdef AMREX_USE_GPU
        Gpu::htod_memcpy
#else
	std::memcpy
#endif
	  (v_d.data(), v.data(), sizeof(T)*ncomp);

        return v_d;
    }